

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_GLSL_LOOP(Context *ctx)

{
  size_t in_RCX;
  char var [64];
  char acStack_58 [72];
  
  get_GLSL_srcarg_varname(ctx,1,acStack_58,in_RCX);
  if (ctx->source_args[0].regnum == 0) {
    output_line(ctx,"{");
    ctx->indent = ctx->indent + 1;
    output_line(ctx,"const int aLend = %s.x + %s.y;",acStack_58,acStack_58);
    output_line(ctx,"for (int aL = %s.y; aL < aLend; aL += %s.z) {",acStack_58,acStack_58);
    ctx->indent = ctx->indent + 1;
    return;
  }
  __assert_fail("ctx->source_args[0].regnum == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0xc49,"void emit_GLSL_LOOP(Context *)");
}

Assistant:

static void emit_GLSL_LOOP(Context *ctx)
{
    // !!! FIXME: swizzle?
    char var[64]; get_GLSL_srcarg_varname(ctx, 1, var, sizeof (var));
    assert(ctx->source_args[0].regnum == 0);  // in case they add aL1 someday.
    output_line(ctx, "{");
    ctx->indent++;
    output_line(ctx, "const int aLend = %s.x + %s.y;", var, var);
    output_line(ctx, "for (int aL = %s.y; aL < aLend; aL += %s.z) {", var, var);
    ctx->indent++;
}